

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

index_t __thiscall GEO::Delaunay3d::stellate_cavity(Delaunay3d *this,index_t v)

{
  index_t t1;
  pointer piVar1;
  index_t iVar2;
  index_t iVar3;
  ulong uVar4;
  index_t f;
  ulong uVar5;
  index_t f_1;
  long lVar6;
  index_t new_tet;
  index_t neigh3;
  index_t neigh2;
  index_t neigh1;
  
  iVar2 = 0xffffffff;
  lVar6 = 0xa7f;
  for (uVar5 = 0; uVar4 = (ulong)(this->cavity_).nb_f_, uVar5 < uVar4; uVar5 = uVar5 + 1) {
    iVar3 = (this->cavity_).tglobal_[uVar5];
    t1 = (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
         super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
         super__Vector_impl_data._M_start[iVar3 * 4 + (this->cavity_).boundary_f_[uVar5]];
    iVar2 = new_tetrahedron(this,v,*(signed_index_t *)((long)this + lVar6 * 4 + -8),
                            *(signed_index_t *)((long)this + lVar6 * 4 + -4),
                            *(signed_index_t *)
                             ((long)&(this->super_Delaunay).super_Counted._vptr_Counted + lVar6 * 4)
                           );
    (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
    super__Vector_impl_data._M_start[iVar2 * 4] = t1;
    iVar3 = find_tet_adjacent(this,t1,iVar3);
    (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
    super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3 + t1 * 4] = iVar2;
    (this->cavity_).tglobal_[uVar5] = iVar2;
    lVar6 = lVar6 + 3;
  }
  for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
    iVar2 = (this->cavity_).tglobal_[uVar5];
    Cavity::get_facet_neighbor_tets(&this->cavity_,(index_t)uVar5,&neigh1,&neigh2,&neigh3);
    uVar4 = (ulong)(iVar2 * 4);
    piVar1 = (this->cell_to_cell_store_).super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>
             .super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1[uVar4 + 1] = neigh1;
    piVar1[uVar4 + 2] = neigh2;
    piVar1[uVar4 + 3] = neigh3;
    uVar4 = (ulong)(this->cavity_).nb_f_;
  }
  return iVar2;
}

Assistant:

index_t Delaunay3d::stellate_cavity(index_t v) {
	
	index_t new_tet = index_t(-1);
	
	for(index_t f=0; f<cavity_.nb_facets(); ++f) {
	    index_t old_tet = cavity_.facet_tet(f);
	    index_t lf = cavity_.facet_facet(f);
	    index_t t_neigh = index_t(tet_adjacent(old_tet, lf));
	    signed_index_t v1 = cavity_.facet_vertex(f,0);
	    signed_index_t v2 = cavity_.facet_vertex(f,1);
	    signed_index_t v3 = cavity_.facet_vertex(f,2);
	    new_tet = new_tetrahedron(signed_index_t(v), v1, v2, v3);
	    set_tet_adjacent(new_tet, 0, t_neigh);
	    set_tet_adjacent(t_neigh, find_tet_adjacent(t_neigh,old_tet), new_tet);
	    cavity_.set_facet_tet(f, new_tet);
	}
	
	for(index_t f=0; f<cavity_.nb_facets(); ++f) {
	    new_tet = cavity_.facet_tet(f);
	    index_t neigh1, neigh2, neigh3;
	    cavity_.get_facet_neighbor_tets(f, neigh1, neigh2, neigh3);
	    set_tet_adjacent(new_tet, 1, neigh1);
	    set_tet_adjacent(new_tet, 2, neigh2);
	    set_tet_adjacent(new_tet, 3, neigh3);		
	}

	return new_tet;
    }